

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::saveModel(FastText *this)

{
  char cVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ofstream ofs;
  
  std::operator+(&local_230,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->output,".bin");
  std::ofstream::ofstream(&ofs,(string *)&local_230,_S_bin);
  std::__cxx11::string::~string((string *)&local_230);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    Args::save((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ostream *)&ofs);
    Dictionary::save((this->dict_).
                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (ostream *)&ofs);
    Matrix::save((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ostream *)&ofs);
    Matrix::save((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ostream *)&ofs);
    std::ofstream::close();
    std::ofstream::~ofstream(&ofs);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Model file cannot be opened for saving!");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void FastText::saveModel() {
  std::ofstream ofs(args_->output + ".bin", std::ofstream::binary);
  if (!ofs.is_open()) {
    std::cerr << "Model file cannot be opened for saving!" << std::endl;
    exit(EXIT_FAILURE);
  }
  args_->save(ofs);
  dict_->save(ofs);
  input_->save(ofs);
  output_->save(ofs);
  ofs.close();
}